

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drm.c
# Opt level: O0

void drm_nouveau_gem_new(uint32_t fd,uint32_t cid,uint32_t parent,drm_nouveau_gem_info *info)

{
  gpu_object *pgVar1;
  uint8_t *puVar2;
  gpu_mapping *pgVar3;
  cpu_mapping *pcVar4;
  cpu_mapping *cmapping;
  gpu_mapping *gmapping;
  gpu_object *obj;
  drm_nouveau_gem_info *info_local;
  uint32_t parent_local;
  uint32_t cid_local;
  uint32_t fd_local;
  
  pgVar1 = gpu_object_add(fd,cid,parent,info->handle,0);
  pgVar1->length = info->size;
  puVar2 = (uint8_t *)realloc(pgVar1->data,pgVar1->length);
  pgVar1->data = puVar2;
  memset(pgVar1->data,0,pgVar1->length);
  pgVar3 = (gpu_mapping *)calloc(0x38,1);
  pgVar3->fd = fd;
  pgVar3->address = info->offset;
  pgVar3->length = info->size;
  pgVar3->object = pgVar1;
  pgVar3->next = pgVar1->gpu_mappings;
  pgVar1->gpu_mappings = pgVar3;
  pcVar4 = (cpu_mapping *)calloc(0x100,1);
  pcVar4->fd = fd;
  pcVar4->fdtype = FDDRM;
  pcVar4->mmap_offset = info->map_handle;
  pcVar4->length = info->size;
  pcVar4->data = pgVar1->data;
  pcVar4->object = pgVar1;
  pcVar4->next = pgVar1->cpu_mappings;
  pgVar1->cpu_mappings = pcVar4;
  return;
}

Assistant:

static void drm_nouveau_gem_new(uint32_t fd, uint32_t cid, uint32_t parent, struct drm_nouveau_gem_info *info)
{
	struct gpu_object *obj = gpu_object_add(fd, cid, parent, info->handle, 0);
	obj->length = info->size;
	obj->data = realloc(obj->data, obj->length);
	memset(obj->data, 0, obj->length);

	struct gpu_mapping *gmapping = calloc(sizeof(struct gpu_mapping), 1);
	gmapping->fd = fd;
	gmapping->address = info->offset;
	gmapping->length = info->size;
	gmapping->object = obj;
	gmapping->next = obj->gpu_mappings;
	obj->gpu_mappings = gmapping;

	struct cpu_mapping *cmapping = calloc(sizeof(struct cpu_mapping), 1);
	cmapping->fd = fd;
	cmapping->fdtype = FDDRM;
	cmapping->mmap_offset = info->map_handle;
	cmapping->length = info->size;
	cmapping->data = obj->data;
	cmapping->object = obj;
	cmapping->next = obj->cpu_mappings;
	obj->cpu_mappings = cmapping;
}